

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_CreateString(char *string)

{
  char *pcVar1;
  cJSON *item;
  char *string_local;
  
  string_local = (char *)cJSON_New_Item();
  if ((cJSON *)string_local != (cJSON *)0x0) {
    ((cJSON *)string_local)->type = 0x10;
    pcVar1 = cJSON_strdup(string);
    ((cJSON *)string_local)->valuestring = pcVar1;
    if (((cJSON *)string_local)->valuestring == (char *)0x0) {
      cJSON_Delete((cJSON *)string_local);
      string_local = (char *)0x0;
    }
  }
  return (cJSON *)string_local;
}

Assistant:

cJSON *cJSON_CreateString(const char *string)	{cJSON *item=cJSON_New_Item();if(item){item->type=cJSON_String;item->valuestring=cJSON_strdup(string);if(!item->valuestring){cJSON_Delete(item);return 0;}}return item;}